

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O1

size_t ans_reorder_fold_compress<7u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  long *plVar1;
  long *plVar2;
  uint8_t *puVar3;
  long lVar4;
  uint8_t *out_u8;
  array<unsigned_long,_4UL> states;
  ans_reorder_fold_encode<7U> ans_frame;
  long *local_d8;
  uint64_t local_d0;
  uint64_t uStack_c8;
  uint64_t uStack_c0;
  uint64_t uStack_b8;
  uint8_t *local_b0;
  ans_reorder_fold_encode<7U> local_a8;
  
  ans_reorder_fold_encode<7U>::create(&local_a8,src,srcSize);
  local_d8 = (long *)dst;
  ans_reorder_fold_encode<7U>::serialize(&local_a8,(uint8_t **)&local_d8);
  local_d0 = local_a8.lower_bound;
  uStack_c8 = local_a8.lower_bound;
  uStack_c0 = local_a8.lower_bound;
  uStack_b8 = local_a8.lower_bound;
  local_b0 = dst;
  if ((srcSize & 3) == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    do {
      ans_reorder_fold_encode<7U>::encode_symbol
                (&local_a8,&local_d0,src[srcSize + lVar4 + -1],(uint8_t **)&local_d8);
      lVar4 = lVar4 + -1;
    } while (-lVar4 != (ulong)((uint)srcSize & 3));
    lVar4 = -lVar4;
  }
  lVar4 = srcSize - lVar4;
  if (lVar4 != 0) {
    do {
      ans_reorder_fold_encode<7U>::encode_symbol
                (&local_a8,&local_d0,src[lVar4 + -1],(uint8_t **)&local_d8);
      ans_reorder_fold_encode<7U>::encode_symbol
                (&local_a8,&uStack_c8,src[lVar4 + -2],(uint8_t **)&local_d8);
      ans_reorder_fold_encode<7U>::encode_symbol
                (&local_a8,&uStack_c0,src[lVar4 + -3],(uint8_t **)&local_d8);
      ans_reorder_fold_encode<7U>::encode_symbol
                (&local_a8,&uStack_b8,src[lVar4 + -4],(uint8_t **)&local_d8);
      lVar4 = lVar4 + -4;
    } while (lVar4 != 0);
  }
  plVar2 = local_d8;
  *local_d8 = local_d0 - local_a8.lower_bound;
  local_d8[1] = uStack_c8 - local_a8.lower_bound;
  local_d8[2] = uStack_c0 - local_a8.lower_bound;
  plVar1 = local_d8 + 3;
  local_d8[3] = uStack_b8 - local_a8.lower_bound;
  local_d8 = plVar1;
  if (local_a8.most_frequent.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.most_frequent.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.most_frequent.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.most_frequent.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  puVar3 = local_b0;
  if (local_a8.mapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.mapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.mapping.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.mapping.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.table.
      super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.table.
                    super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.table.
                          super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.table.
                          super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (long)plVar2 + (0x20 - (long)puVar3);
}

Assistant:

size_t ans_reorder_fold_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_reorder_fold_encode<fidelity>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    // start encoding
    std::array<uint64_t, 4> states;
    states[0] = ans_frame.initial_state();
    states[1] = ans_frame.initial_state();
    states[2] = ans_frame.initial_state();
    states[3] = ans_frame.initial_state();

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % 4 != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += 4;
    }

    // flush final state
    ans_frame.flush_state(states[0], out_u8);
    ans_frame.flush_state(states[1], out_u8);
    ans_frame.flush_state(states[2], out_u8);
    ans_frame.flush_state(states[3], out_u8);

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}